

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::OriginPubkeyProvider::ToString_abi_cxx11_
          (OriginPubkeyProvider *this,StringType type)

{
  pointer pPVar1;
  uint in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff58;
  StringType in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  OriginString_abi_cxx11_
            ((OriginPubkeyProvider *)CONCAT44(in_EDX,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c,SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
  std::operator+((char *)in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  pPVar1 = std::
           unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           ::operator->((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                         *)in_stack_ffffffffffffff28);
  (*pPVar1->_vptr_PubkeyProvider[5])(local_88,pPVar1,(ulong)in_EDX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_EDX,in_stack_ffffffffffffff60),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(StringType type) const override { return "[" + OriginString(type) + "]" + m_provider->ToString(type); }